

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O3

bool __thiscall llvm::yaml::Scanner::scanBlockEntry(Scanner *this)

{
  list_type *InsertPoint;
  iterator pcVar1;
  ilist_node_base<false> *piVar2;
  ilist_node_base<false> *piVar3;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  undefined4 uStack_54;
  undefined1 local_38 [16];
  
  InsertPoint = &(this->TokenQueue).List;
  rollIndent(this,this->Column,TK_BlockSequenceStart,(iterator)InsertPoint);
  removeSimpleKeyCandidatesOnFlowLevel(this,this->FlowLevel);
  this->IsSimpleKeyAllowed = true;
  local_38[0] = 0;
  pcVar1 = this->Current;
  skip(this,1);
  piVar3 = (ilist_node_base<false> *)
           BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Allocate
                     (&(this->TokenQueue).
                       super_BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>,0x48,
                      (Align)0x4);
  piVar3->Prev = (ilist_node_base<false> *)0x0;
  piVar3->Next = (ilist_node_base<false> *)0x0;
  uStack_58 = SUB84(pcVar1,0);
  uStack_54 = (undefined4)((ulong)pcVar1 >> 0x20);
  *(undefined4 *)&piVar3[1].Prev = 7;
  *(undefined4 *)((long)(piVar3 + 1) + 4) = uStack_5c;
  *(undefined4 *)((long)(piVar3 + 1) + 8) = uStack_58;
  *(undefined4 *)((long)(piVar3 + 1) + 0xc) = uStack_54;
  piVar3[2].Prev = (ilist_node_base<false> *)0x1;
  *(ilist_node_base<false> **)((long)(piVar3 + 2) + 8) =
       (ilist_node_base<false> *)((long)(piVar3 + 3) + 8);
  std::__cxx11::string::_M_construct<char*>((string *)((long)(piVar3 + 2) + 8),local_38,local_38);
  piVar2 = (InsertPoint->Sentinel).
           super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
           .super_node_base_type.Prev;
  piVar3->Next = (ilist_node_base<false> *)InsertPoint;
  piVar3->Prev = piVar2;
  piVar2->Next = piVar3;
  (InsertPoint->Sentinel).
  super_ilist_node_impl<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>_>
  .super_node_base_type.Prev = piVar3;
  return true;
}

Assistant:

bool Scanner::scanBlockEntry() {
  rollIndent(Column, Token::TK_BlockSequenceStart, TokenQueue.end());
  removeSimpleKeyCandidatesOnFlowLevel(FlowLevel);
  IsSimpleKeyAllowed = true;
  Token T;
  T.Kind = Token::TK_BlockEntry;
  T.Range = StringRef(Current, 1);
  skip(1);
  TokenQueue.push_back(T);
  return true;
}